

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O1

String * __thiscall
capnp::JsonCodec::encodeRaw(String *__return_storage_ptr__,JsonCodec *this,Reader value)

{
  char *pcVar1;
  size_t sVar2;
  Branch *pBVar3;
  bool multiline;
  bool local_49;
  StringTree local_48;
  
  local_49 = false;
  Impl::encodeRaw(&local_48,(this->impl).ptr,value,0,&local_49,false);
  kj::StringTree::flatten(__return_storage_ptr__,&local_48);
  sVar2 = local_48.branches.size_;
  pBVar3 = local_48.branches.ptr;
  if (local_48.branches.ptr != (Branch *)0x0) {
    local_48.branches.ptr = (Branch *)0x0;
    local_48.branches.size_ = 0;
    (**(local_48.branches.disposer)->_vptr_ArrayDisposer)
              (local_48.branches.disposer,pBVar3,0x40,sVar2,sVar2,
               kj::ArrayDisposer::Dispose_<kj::StringTree::Branch,_false>::destruct);
  }
  sVar2 = local_48.text.content.size_;
  pcVar1 = local_48.text.content.ptr;
  if (local_48.text.content.ptr != (char *)0x0) {
    local_48.text.content.ptr = (char *)0x0;
    local_48.text.content.size_ = 0;
    (**(local_48.text.content.disposer)->_vptr_ArrayDisposer)
              (local_48.text.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::String JsonCodec::encodeRaw(JsonValue::Reader value) const {
  bool multiline = false;
  return impl->encodeRaw(value, 0, multiline, false).flatten();
}